

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

_Bool upb_Map_Get(upb_Map *map,upb_MessageValue key,upb_MessageValue *val)

{
  _Bool _Var1;
  double local_10;
  size_t local_8;
  
  local_8 = key.str_val.size;
  local_10 = key.double_val;
  _Var1 = _upb_Map_Get(map,&local_10,(long)map->key_size,val,(long)map->val_size);
  return _Var1;
}

Assistant:

UPB_INLINE bool _upb_Map_Get(const struct upb_Map* map, const void* key,
                             size_t key_size, void* val, size_t val_size) {
  upb_value tabval = {0};
  bool ret;
  if (map->UPB_PRIVATE(is_strtable)) {
    upb_StringView k = _upb_map_tokey(key, key_size);
    ret = upb_strtable_lookup2(&map->t.strtable, k.data, k.size, &tabval);
  } else {
    uintptr_t intkey = _upb_map_tointkey(key, key_size);
    ret = upb_inttable_lookup(&map->t.inttable, intkey, &tabval);
  }
  if (ret && val) {
    _upb_map_fromvalue(tabval, val, val_size);
  }
  return ret;
}